

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_trc.c
# Opt level: O0

CURLcode Curl_trc_opt(char *config)

{
  undefined4 local_18;
  CURLcode result;
  char *config_local;
  
  if (config == (char *)0x0) {
    local_18 = CURLE_OK;
  }
  else {
    local_18 = trc_opt(config);
  }
  return local_18;
}

Assistant:

CURLcode Curl_trc_opt(const char *config)
{
  CURLcode result = config ? trc_opt(config) : CURLE_OK;
#ifdef DEBUGBUILD
  /* CURL_DEBUG can override anything */
  if(!result) {
    const char *dbg_config = getenv("CURL_DEBUG");
    if(dbg_config)
      result = trc_opt(dbg_config);
  }
#endif /* DEBUGBUILD */
  return result;
}